

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseAttributeListDecl(xmlParserCtxtPtr ctxt)

{
  bool bVar1;
  int iVar2;
  xmlChar *local_40;
  xmlChar *defaultValue;
  int local_30;
  int def;
  int type;
  int inputid;
  xmlEnumerationPtr tree;
  xmlChar *attrName;
  xmlChar *elemName;
  xmlParserCtxtPtr ctxt_local;
  
  if ((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '!')) {
    ctxt->input->cur = ctxt->input->cur + 2;
    ctxt->input->col = ctxt->input->col + 2;
    elemName = (xmlChar *)ctxt;
    if (*ctxt->input->cur == '\0') {
      xmlParserGrow(ctxt);
    }
    if (((((**(char **)(*(long *)(elemName + 0x38) + 0x20) == 'A') &&
          (*(char *)(*(long *)(*(long *)(elemName + 0x38) + 0x20) + 1) == 'T')) &&
         (*(char *)(*(long *)(*(long *)(elemName + 0x38) + 0x20) + 2) == 'T')) &&
        ((*(char *)(*(long *)(*(long *)(elemName + 0x38) + 0x20) + 3) == 'L' &&
         (*(char *)(*(long *)(*(long *)(elemName + 0x38) + 0x20) + 4) == 'I')))) &&
       ((*(char *)(*(long *)(*(long *)(elemName + 0x38) + 0x20) + 5) == 'S' &&
        (*(char *)(*(long *)(*(long *)(elemName + 0x38) + 0x20) + 6) == 'T')))) {
      def = *(int *)(*(long *)(elemName + 0x38) + 100);
      *(long *)(*(long *)(elemName + 0x38) + 0x20) =
           *(long *)(*(long *)(elemName + 0x38) + 0x20) + 7;
      *(int *)(*(long *)(elemName + 0x38) + 0x38) = *(int *)(*(long *)(elemName + 0x38) + 0x38) + 7;
      if (**(char **)(*(long *)(elemName + 0x38) + 0x20) == '\0') {
        xmlParserGrow((xmlParserCtxtPtr)elemName);
      }
      iVar2 = xmlSkipBlankCharsPE((xmlParserCtxtPtr)elemName);
      if (iVar2 == 0) {
        xmlFatalErrMsg((xmlParserCtxtPtr)elemName,XML_ERR_SPACE_REQUIRED,
                       "Space required after \'<!ATTLIST\'\n");
      }
      attrName = xmlParseName((xmlParserCtxtPtr)elemName);
      if (attrName == (xmlChar *)0x0) {
        xmlFatalErrMsg((xmlParserCtxtPtr)elemName,XML_ERR_NAME_REQUIRED,
                       "ATTLIST: no name for Element\n");
      }
      else {
        xmlSkipBlankCharsPE((xmlParserCtxtPtr)elemName);
        if (((*(uint *)(*(long *)(elemName + 0x38) + 0x60) & 0x40) == 0) &&
           (*(long *)(*(long *)(elemName + 0x38) + 0x28) -
            *(long *)(*(long *)(elemName + 0x38) + 0x20) < 0xfa)) {
          xmlParserGrow((xmlParserCtxtPtr)elemName);
        }
        while( true ) {
          bVar1 = false;
          if (**(char **)(*(long *)(elemName + 0x38) + 0x20) != '>') {
            bVar1 = *(int *)(elemName + 0x14c) < 2;
          }
          if (!bVar1) goto LAB_001446bc;
          local_40 = (xmlChar *)0x0;
          if (((*(uint *)(*(long *)(elemName + 0x38) + 0x60) & 0x40) == 0) &&
             (*(long *)(*(long *)(elemName + 0x38) + 0x28) -
              *(long *)(*(long *)(elemName + 0x38) + 0x20) < 0xfa)) {
            xmlParserGrow((xmlParserCtxtPtr)elemName);
          }
          _type = (xmlEnumerationPtr)0x0;
          tree = (xmlEnumerationPtr)xmlParseName((xmlParserCtxtPtr)elemName);
          if (tree == (xmlEnumerationPtr)0x0) {
            xmlFatalErrMsg((xmlParserCtxtPtr)elemName,XML_ERR_NAME_REQUIRED,
                           "ATTLIST: no name for Attribute\n");
            goto LAB_001446bc;
          }
          if (((*(uint *)(*(long *)(elemName + 0x38) + 0x60) & 0x40) == 0) &&
             (*(long *)(*(long *)(elemName + 0x38) + 0x28) -
              *(long *)(*(long *)(elemName + 0x38) + 0x20) < 0xfa)) {
            xmlParserGrow((xmlParserCtxtPtr)elemName);
          }
          iVar2 = xmlSkipBlankCharsPE((xmlParserCtxtPtr)elemName);
          if (iVar2 == 0) {
            xmlFatalErrMsg((xmlParserCtxtPtr)elemName,XML_ERR_SPACE_REQUIRED,
                           "Space required after the attribute name\n");
            goto LAB_001446bc;
          }
          local_30 = xmlParseAttributeType((xmlParserCtxtPtr)elemName,(xmlEnumerationPtr *)&type);
          if (local_30 < 1) goto LAB_001446bc;
          if (((*(uint *)(*(long *)(elemName + 0x38) + 0x60) & 0x40) == 0) &&
             (*(long *)(*(long *)(elemName + 0x38) + 0x28) -
              *(long *)(*(long *)(elemName + 0x38) + 0x20) < 0xfa)) {
            xmlParserGrow((xmlParserCtxtPtr)elemName);
          }
          iVar2 = xmlSkipBlankCharsPE((xmlParserCtxtPtr)elemName);
          if (iVar2 == 0) {
            xmlFatalErrMsg((xmlParserCtxtPtr)elemName,XML_ERR_SPACE_REQUIRED,
                           "Space required after the attribute type\n");
            if (_type != (xmlEnumerationPtr)0x0) {
              xmlFreeEnumeration(_type);
            }
            goto LAB_001446bc;
          }
          defaultValue._4_4_ = xmlParseDefaultDecl((xmlParserCtxtPtr)elemName,&local_40);
          if (defaultValue._4_4_ < 1) {
            if (local_40 != (xmlChar *)0x0) {
              (*xmlFree)(local_40);
            }
            if (_type != (xmlEnumerationPtr)0x0) {
              xmlFreeEnumeration(_type);
            }
            goto LAB_001446bc;
          }
          if ((local_30 != 1) && (local_40 != (xmlChar *)0x0)) {
            xmlAttrNormalizeSpace(local_40,local_40);
          }
          if (((*(uint *)(*(long *)(elemName + 0x38) + 0x60) & 0x40) == 0) &&
             (*(long *)(*(long *)(elemName + 0x38) + 0x28) -
              *(long *)(*(long *)(elemName + 0x38) + 0x20) < 0xfa)) {
            xmlParserGrow((xmlParserCtxtPtr)elemName);
          }
          if ((**(char **)(*(long *)(elemName + 0x38) + 0x20) != '>') &&
             (iVar2 = xmlSkipBlankCharsPE((xmlParserCtxtPtr)elemName), iVar2 == 0)) break;
          if (((*(long *)elemName == 0) || (*(int *)(elemName + 0x14c) != 0)) ||
             (*(long *)(*(long *)elemName + 0x40) == 0)) {
            if (_type != (xmlEnumerationPtr)0x0) {
              xmlFreeEnumeration(_type);
            }
          }
          else {
            (**(code **)(*(long *)elemName + 0x40))
                      (*(undefined8 *)(elemName + 8),attrName,tree,local_30,defaultValue._4_4_,
                       local_40,_type);
          }
          if (((*(int *)(elemName + 0x1f8) != 0) && (local_40 != (xmlChar *)0x0)) &&
             ((defaultValue._4_4_ != 3 && (defaultValue._4_4_ != 2)))) {
            xmlAddDefAttrs((xmlParserCtxtPtr)elemName,attrName,(xmlChar *)tree,local_40);
          }
          if (*(int *)(elemName + 0x1f8) != 0) {
            xmlAddSpecialAttr((xmlParserCtxtPtr)elemName,attrName,(xmlChar *)tree,local_30);
          }
          if (local_40 != (xmlChar *)0x0) {
            (*xmlFree)(local_40);
          }
          if (((*(uint *)(*(long *)(elemName + 0x38) + 0x60) & 0x40) == 0) &&
             (*(long *)(*(long *)(elemName + 0x38) + 0x28) -
              *(long *)(*(long *)(elemName + 0x38) + 0x20) < 0xfa)) {
            xmlParserGrow((xmlParserCtxtPtr)elemName);
          }
        }
        xmlFatalErrMsg((xmlParserCtxtPtr)elemName,XML_ERR_SPACE_REQUIRED,
                       "Space required after the attribute default value\n");
        if (local_40 != (xmlChar *)0x0) {
          (*xmlFree)(local_40);
        }
        if (_type != (xmlEnumerationPtr)0x0) {
          xmlFreeEnumeration(_type);
        }
LAB_001446bc:
        if (**(char **)(*(long *)(elemName + 0x38) + 0x20) == '>') {
          if (def != *(int *)(*(long *)(elemName + 0x38) + 100)) {
            xmlFatalErrMsg((xmlParserCtxtPtr)elemName,XML_ERR_ENTITY_BOUNDARY,
                           "Attribute list declaration doesn\'t start and stop in the same entity\n"
                          );
          }
          xmlNextChar((xmlParserCtxtPtr)elemName);
        }
      }
    }
  }
  return;
}

Assistant:

void
xmlParseAttributeListDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *elemName;
    const xmlChar *attrName;
    xmlEnumerationPtr tree;

    if ((CUR != '<') || (NXT(1) != '!'))
        return;
    SKIP(2);

    if (CMP7(CUR_PTR, 'A', 'T', 'T', 'L', 'I', 'S', 'T')) {
	int inputid = ctxt->input->id;

	SKIP(7);
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		                 "Space required after '<!ATTLIST'\n");
	}
        elemName = xmlParseName(ctxt);
	if (elemName == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			   "ATTLIST: no name for Element\n");
	    return;
	}
	SKIP_BLANKS_PE;
	GROW;
	while ((RAW != '>') && (PARSER_STOPPED(ctxt) == 0)) {
	    int type;
	    int def;
	    xmlChar *defaultValue = NULL;

	    GROW;
            tree = NULL;
	    attrName = xmlParseName(ctxt);
	    if (attrName == NULL) {
		xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			       "ATTLIST: no name for Attribute\n");
		break;
	    }
	    GROW;
	    if (SKIP_BLANKS_PE == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		        "Space required after the attribute name\n");
		break;
	    }

	    type = xmlParseAttributeType(ctxt, &tree);
	    if (type <= 0) {
	        break;
	    }

	    GROW;
	    if (SKIP_BLANKS_PE == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			       "Space required after the attribute type\n");
	        if (tree != NULL)
		    xmlFreeEnumeration(tree);
		break;
	    }

	    def = xmlParseDefaultDecl(ctxt, &defaultValue);
	    if (def <= 0) {
                if (defaultValue != NULL)
		    xmlFree(defaultValue);
	        if (tree != NULL)
		    xmlFreeEnumeration(tree);
	        break;
	    }
	    if ((type != XML_ATTRIBUTE_CDATA) && (defaultValue != NULL))
	        xmlAttrNormalizeSpace(defaultValue, defaultValue);

	    GROW;
            if (RAW != '>') {
		if (SKIP_BLANKS_PE == 0) {
		    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			"Space required after the attribute default value\n");
		    if (defaultValue != NULL)
			xmlFree(defaultValue);
		    if (tree != NULL)
			xmlFreeEnumeration(tree);
		    break;
		}
	    }
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		(ctxt->sax->attributeDecl != NULL))
		ctxt->sax->attributeDecl(ctxt->userData, elemName, attrName,
	                        type, def, defaultValue, tree);
	    else if (tree != NULL)
		xmlFreeEnumeration(tree);

	    if ((ctxt->sax2) && (defaultValue != NULL) &&
	        (def != XML_ATTRIBUTE_IMPLIED) &&
		(def != XML_ATTRIBUTE_REQUIRED)) {
		xmlAddDefAttrs(ctxt, elemName, attrName, defaultValue);
	    }
	    if (ctxt->sax2) {
		xmlAddSpecialAttr(ctxt, elemName, attrName, type);
	    }
	    if (defaultValue != NULL)
	        xmlFree(defaultValue);
	    GROW;
	}
	if (RAW == '>') {
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Attribute list declaration doesn't start and"
                               " stop in the same entity\n");
	    }
	    NEXT;
	}
    }
}